

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O1

void __thiscall
imrt::EvaluationFunction::update_sorted_voxels
          (EvaluationFunction *this,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax,int o,int k)

{
  set<std::pair<double,_std::pair<int,_int>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
  *this_00;
  double dVar1;
  pointer pvVar2;
  long lVar3;
  pair<int,_int> pVar4;
  double dVar5;
  double dVar6;
  pair<std::_Rb_tree_iterator<std::pair<double,_std::pair<int,_int>_>_>,_std::_Rb_tree_iterator<std::pair<double,_std::pair<int,_int>_>_>_>
  pVar7;
  key_type local_40;
  
  this_00 = &this->voxels;
  lVar3 = (long)k;
  pVar4.second = k;
  pVar4.first = o;
  local_40.first =
       *(double *)
        (*(long *)&(this->D).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[o].
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data + lVar3 * 8);
  local_40.second = pVar4;
  pVar7 = std::
          _Rb_tree<std::pair<double,_std::pair<int,_int>_>,_std::pair<double,_std::pair<int,_int>_>,_std::_Identity<std::pair<double,_std::pair<int,_int>_>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
          ::equal_range(&this_00->_M_t,&local_40);
  std::
  _Rb_tree<std::pair<double,_std::pair<int,_int>_>,_std::pair<double,_std::pair<int,_int>_>,_std::_Identity<std::pair<double,_std::pair<int,_int>_>_>,_imrt::MagnitudeCompare,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
  ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar7.first._M_node,(_Base_ptr)pVar7.second._M_node);
  dVar6 = (Zmin->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start[o];
  dVar5 = 0.0;
  dVar1 = *(double *)
           (*(long *)&(this->Z).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[o].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + lVar3 * 8);
  if (dVar6 <= 0.0) {
    dVar6 = (Zmax->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[o];
    if (dVar1 <= dVar6) goto LAB_0011441a;
  }
  else if (dVar6 <= dVar1) goto LAB_0011441a;
  dVar5 = ((dVar1 - dVar6) *
          (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
          _M_start[o]) /
          (double)(this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[o];
LAB_0011441a:
  pvVar2 = (this->D).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(double *)
   (*(long *)&pvVar2[o].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data + lVar3 * 8) = dVar5;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    local_40.first =
         *(double *)
          (*(long *)&pvVar2[o].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data + lVar3 * 8);
    local_40.second = pVar4;
    std::
    _Rb_tree<std::pair<double,std::pair<int,int>>,std::pair<double,std::pair<int,int>>,std::_Identity<std::pair<double,std::pair<int,int>>>,imrt::MagnitudeCompare,std::allocator<std::pair<double,std::pair<int,int>>>>
    ::_M_insert_unique<std::pair<double,std::pair<int,int>>>
              ((_Rb_tree<std::pair<double,std::pair<int,int>>,std::pair<double,std::pair<int,int>>,std::_Identity<std::pair<double,std::pair<int,int>>>,imrt::MagnitudeCompare,std::allocator<std::pair<double,std::pair<int,int>>>>
                *)this_00,&local_40);
  }
  return;
}

Assistant:

void EvaluationFunction::update_sorted_voxels(vector<double>& w,
	vector<double>& Zmin, vector<double>& Zmax, int o, int k){
		voxels.erase(make_pair(D[o][k],make_pair(o,k)));

		if(Zmin[o]>0){
			 if(Z[o][k] < Zmin[o])  D[o][k]=w[o]*(Z[o][k]-Zmin[o])/nb_voxels[o];
			 else D[o][k]=0.0;
		}else{
			if(Z[o][k] > Zmax[o]) D[o][k]=w[o]*(Z[o][k]-Zmax[o])/nb_voxels[o];
			else D[o][k]=0.0;
		}
		if(D[o][k]!=0.0)
			voxels.insert(make_pair(D[o][k],make_pair(o,k)));
}